

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *context,ArgumentDirection direction,ModportNamedPortSyntax *syntax)

{
  SourceLocation location;
  bool bVar1;
  Compilation *this;
  ModportPortSymbol *this_00;
  Symbol *pSVar2;
  DeclaredType *target;
  not_null<slang::ast::DeclaredType_*> nVar3;
  DeclaredType *this_01;
  Expression *this_02;
  Diagnostic *pDVar4;
  bitmask<slang::ast::AssignFlags> flags;
  DiagCode code;
  string_view sVar5;
  LookupLocation LVar6;
  SourceRange SVar7;
  LookupLocation location_00;
  undefined1 constraintAllowed;
  ArgumentDirection direction_local;
  ASTContext *local_b0;
  Compilation *local_a8;
  Scope *local_a0;
  Token name;
  SourceLocation local_70;
  ASTContext checkCtx;
  
  direction_local = direction;
  this = ASTContext::getCompilation(context);
  name.kind = (syntax->name).kind;
  name._2_1_ = (syntax->name).field_0x2;
  name.numFlags.raw = (syntax->name).numFlags.raw;
  name.rawLen = (syntax->name).rawLen;
  name.info = (syntax->name).info;
  checkCtx._0_16_ = parsing::Token::valueText(&name);
  local_70 = parsing::Token::location(&name);
  local_a8 = this;
  this_00 = BumpAllocator::
            emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                      (&this->super_BumpAllocator,
                       (basic_string_view<char,_std::char_traits<char>_> *)&checkCtx,&local_70,
                       &direction_local);
  (this_00->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_a0 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  sVar5 = parsing::Token::valueText(&name);
  local_b0 = context;
  LVar6 = ASTContext::getLocation(context);
  SVar7 = parsing::Token::range(&name);
  constraintAllowed = SVar7.startLoc._0_1_;
  location_00._12_4_ = 0;
  location_00.scope = (Scope *)SUB128(LVar6._0_12_,0);
  location_00.index = SUB124(LVar6._0_12_,8);
  pSVar2 = Lookup::unqualifiedAt
                     (local_a0,sVar5,location_00,SVar7,(bitmask<slang::ast::LookupFlags>)0x40);
  this_00->internalSymbol = pSVar2;
  if (pSVar2 != (Symbol *)0x0) {
    code.subsystem = Declarations;
    code.code = 0x22;
    if (pSVar2->kind != Subroutine) {
      bVar1 = SemanticFacts::isAllowedInModport(pSVar2->kind);
      code.subsystem = Declarations;
      code.code = 0x6a;
      if (bVar1) {
        if (this_00->internalSymbol != (Symbol *)0x0) {
          target = Symbol::getDeclaredType(this_00->internalSymbol);
          if (target == (DeclaredType *)0x0) {
            assert::assertFailed
                      ("sourceType",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                       ,0xbd,
                       "static ModportPortSymbol &slang::ast::ModportPortSymbol::fromSyntax(const ASTContext &, ArgumentDirection, const ModportNamedPortSyntax &)"
                      );
          }
          nVar3 = ValueSymbol::getDeclaredType(&this_00->super_ValueSymbol);
          checkCtx.scope.ptr = (Scope *)nVar3.ptr;
          this_01 = not_null<slang::ast::DeclaredType_*>::get
                              ((not_null<slang::ast::DeclaredType_*> *)&checkCtx);
          DeclaredType::setLink(this_01,target);
          if (direction_local == In) {
            return this_00;
          }
          ASTContext::resetFlags(&checkCtx,local_b0,(bitmask<slang::ast::ASTFlags>)0x80);
          location = (this_00->super_ValueSymbol).super_Symbol.location;
          SVar7.startLoc =
               (this_00->super_ValueSymbol).super_Symbol.name._M_len * 0x10000000 + (long)location;
          SVar7.endLoc = (SourceLocation)0x0;
          this_02 = ValueExpressionBase::fromSymbol
                              ((ValueExpressionBase *)&checkCtx,
                               (ASTContext *)this_00->internalSymbol,(Symbol *)0x0,location._0_1_,
                               SVar7,(bool)constraintAllowed);
          if (direction_local == Ref) {
            bVar1 = Expression::canConnectToRefArg(this_02,false,false);
            if (bVar1) {
              return this_00;
            }
            pDVar4 = ASTContext::addDiag(&checkCtx,(DiagCode)0x590007,location);
            Diagnostic::operator<<(pDVar4,this_02->sourceRange);
            return this_00;
          }
          if (direction_local == InOut) {
            flags.m_bits = 0x210;
          }
          else {
            if (direction_local != Out) {
              return this_00;
            }
            flags.m_bits = 0x200;
          }
          Expression::requireLValue
                    (this_02,&checkCtx,location,flags,(Expression *)0x0,(EvalContext *)0x0);
          return this_00;
        }
        goto LAB_001a790e;
      }
    }
    SVar7 = parsing::Token::range(&name);
    pDVar4 = ASTContext::addDiag(local_b0,code,SVar7);
    sVar5 = parsing::Token::valueText(&name);
    Diagnostic::operator<<(pDVar4,sVar5);
    Diagnostic::addNote(pDVar4,(DiagCode)0x40001,this_00->internalSymbol->location);
    this_00->internalSymbol = (Symbol *)0x0;
  }
LAB_001a790e:
  (this_00->super_ValueSymbol).declaredType.type = local_a8->errorType;
  return this_00;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& context,
                                                 ArgumentDirection direction,
                                                 const ModportNamedPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);
    result->internalSymbol = Lookup::unqualifiedAt(*context.scope, name.valueText(),
                                                   context.getLocation(), name.range(),
                                                   LookupFlags::NoParentScope);

    if (result->internalSymbol) {
        if (result->internalSymbol->kind == SymbolKind::Subroutine) {
            auto& diag = context.addDiag(diag::ExpectedImportExport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
        else if (!SemanticFacts::isAllowedInModport(result->internalSymbol->kind)) {
            auto& diag = context.addDiag(diag::NotAllowedInModport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
    }

    if (!result->internalSymbol) {
        result->setType(comp.getErrorType());
        return *result;
    }

    auto sourceType = result->internalSymbol->getDeclaredType();
    ASSERT(sourceType);
    result->getDeclaredType()->setLink(*sourceType);

    // Perform checking on the connected symbol to make sure it's allowed
    // given the modport's direction.
    if (direction != ArgumentDirection::In) {
        ASTContext checkCtx = context.resetFlags(ASTFlags::NonProcedural);

        auto loc = result->location;
        auto& expr = ValueExpressionBase::fromSymbol(checkCtx, *result->internalSymbol, false,
                                                     {loc, loc + result->name.length()});

        switch (direction) {
            case ArgumentDirection::In:
                // unreachable
                break;
            case ArgumentDirection::Out:
                expr.requireLValue(checkCtx, loc, AssignFlags::ModportConn);
                break;
            case ArgumentDirection::InOut:
                expr.requireLValue(checkCtx, loc,
                                   AssignFlags::ModportConn | AssignFlags::InOutPort);
                break;
            case ArgumentDirection::Ref:
                if (!expr.canConnectToRefArg(/* isConstRef */ false))
                    checkCtx.addDiag(diag::InvalidRefArg, loc) << expr.sourceRange;
                break;
        }
    }

    return *result;
}